

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

void __thiscall iDynTree::AttitudeQuaternionEKF::deserializeStateVector(AttitudeQuaternionEKF *this)

{
  double dVar1;
  double *pdVar2;
  PointerType ptr;
  
  pdVar2 = (double *)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  dVar1 = pdVar2[1];
  (this->m_state_qekf).m_orientation.m_data[0] = *pdVar2;
  (this->m_state_qekf).m_orientation.m_data[1] = dVar1;
  dVar1 = pdVar2[3];
  (this->m_state_qekf).m_orientation.m_data[2] = pdVar2[2];
  (this->m_state_qekf).m_orientation.m_data[3] = dVar1;
  dVar1 = pdVar2[5];
  (this->m_state_qekf).m_angular_velocity.m_data[0] = pdVar2[4];
  (this->m_state_qekf).m_angular_velocity.m_data[1] = dVar1;
  (this->m_state_qekf).m_angular_velocity.m_data[2] = pdVar2[6];
  dVar1 = pdVar2[8];
  (this->m_state_qekf).m_gyroscope_bias.m_data[0] = pdVar2[7];
  (this->m_state_qekf).m_gyroscope_bias.m_data[1] = dVar1;
  (this->m_state_qekf).m_gyroscope_bias.m_data[2] = pdVar2[9];
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::deserializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    q = x.block<4, 1>(0, 0);
    Omega = x.block<3, 1>(4, 0);
    b = x.block<3, 1>(7, 0);
}